

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * anon_unknown.dwarf_2e466::reductionBarrettPrecomputation(BN *__return_storage_ptr__,BN *mod)

{
  pointer puVar1;
  pointer puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> ba;
  allocator_type local_69;
  BN local_68;
  BN local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_38;
  
  puVar1 = (mod->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (mod->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_38,(long)puVar1 + (1 - (long)puVar2),(allocator_type *)&local_68);
  local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 1;
  std::vector<unsigned_short,std::allocator<unsigned_short>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_50,
             (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )(local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start + (long)puVar1 + (1 - (long)puVar2)),&local_69);
  BN::operator/(&local_68,&local_50,mod);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&__return_storage_ptr__->ba,&local_68.ba);
  if (local_68.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

const BN reductionBarrettPrecomputation(const BN& mod) {
    size_t rbc = mod.digitCount() * 2 + 1;
    vector<bt> ba(rbc);
    ba.back() = 1;
    return move(BN(ba, rbc) / mod);
}